

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O1

int Separated(BoundingBox *a,BoundingBox *b)

{
  double *pdVar1;
  uint uVar2;
  double dVar3;
  
  dVar3 = (a->TL).Pos[0] + -2.0;
  uVar2 = 1;
  if (((dVar3 < (b->BR).Pos[0] || dVar3 == (b->BR).Pos[0]) &&
      (dVar3 = (a->TL).Pos[1] + -2.0, pdVar1 = (b->BR).Pos + 1, dVar3 < *pdVar1 || dVar3 == *pdVar1)
      ) && (dVar3 = (b->TL).Pos[0] + -2.0, dVar3 < (a->BR).Pos[0] || dVar3 == (a->BR).Pos[0])) {
    dVar3 = (b->TL).Pos[1] + -2.0;
    pdVar1 = (a->BR).Pos + 1;
    uVar2 = (uint)(*pdVar1 <= dVar3 && dVar3 != *pdVar1);
  }
  return uVar2;
}

Assistant:

static int Separated(struct BoundingBox *a, struct BoundingBox *b)
{
   if (a->TL.Pos[0] - ERROR_BOUNDARY > b->BR.Pos[0])
      return true;
   if (a->TL.Pos[1] - ERROR_BOUNDARY > b->BR.Pos[1])
      return true;

   if (b->TL.Pos[0] - ERROR_BOUNDARY > a->BR.Pos[0])
      return true;
   if (b->TL.Pos[1] - ERROR_BOUNDARY > a->BR.Pos[1])
      return true;

   return false;
}